

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O2

int mbedtls_ccm_self_test(int verbose)

{
  size_t __n;
  size_t iv_len;
  size_t add_len;
  size_t tag_len;
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uchar (*local_e0) [32];
  uchar plaintext [24];
  uchar ciphertext [32];
  mbedtls_ccm_context ctx;
  
  ctx.cipher_ctx.cipher_info = (mbedtls_cipher_info_t *)0x0;
  ctx.cipher_ctx.key_bitlen = 0;
  ctx.cipher_ctx.operation = MBEDTLS_DECRYPT;
  ctx.cipher_ctx.add_padding = (_func_void_uchar_ptr_size_t_size_t *)0x0;
  ctx.cipher_ctx.get_padding = (_func_int_uchar_ptr_size_t_size_t_ptr *)0x0;
  ctx.cipher_ctx.unprocessed_data[0] = '\0';
  ctx.cipher_ctx.unprocessed_data[1] = '\0';
  ctx.cipher_ctx.unprocessed_data[2] = '\0';
  ctx.cipher_ctx.unprocessed_data[3] = '\0';
  ctx.cipher_ctx.unprocessed_data[4] = '\0';
  ctx.cipher_ctx.unprocessed_data[5] = '\0';
  ctx.cipher_ctx.unprocessed_data[6] = '\0';
  ctx.cipher_ctx.unprocessed_data[7] = '\0';
  ctx.cipher_ctx.unprocessed_data[8] = '\0';
  ctx.cipher_ctx.unprocessed_data[9] = '\0';
  ctx.cipher_ctx.unprocessed_data[10] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xb] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xc] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xd] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xe] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xf] = '\0';
  ctx.cipher_ctx.unprocessed_len = 0;
  ctx.cipher_ctx.iv[0] = '\0';
  ctx.cipher_ctx.iv[1] = '\0';
  ctx.cipher_ctx.iv[2] = '\0';
  ctx.cipher_ctx.iv[3] = '\0';
  ctx.cipher_ctx.iv[4] = '\0';
  ctx.cipher_ctx.iv[5] = '\0';
  ctx.cipher_ctx.iv[6] = '\0';
  ctx.cipher_ctx.iv[7] = '\0';
  ctx.cipher_ctx.iv[8] = '\0';
  ctx.cipher_ctx.iv[9] = '\0';
  ctx.cipher_ctx.iv[10] = '\0';
  ctx.cipher_ctx.iv[0xb] = '\0';
  ctx.cipher_ctx.iv[0xc] = '\0';
  ctx.cipher_ctx.iv[0xd] = '\0';
  ctx.cipher_ctx.iv[0xe] = '\0';
  ctx.cipher_ctx.iv[0xf] = '\0';
  ctx.cipher_ctx.iv_size = 0;
  ctx.cipher_ctx.cipher_ctx = (void *)0x0;
  ctx.cipher_ctx.cmac_ctx = (mbedtls_cmac_context_t *)0x0;
  iVar1 = mbedtls_ccm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,"@ABCDEFGHIJKLMNO",0x80);
  uVar3 = 1;
  iVar2 = 1;
  if (iVar1 == 0) {
    local_e0 = res_test_data;
    for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
      if (verbose != 0) {
        printf("  CCM-AES #%u: ",(ulong)uVar3);
      }
      plaintext[0x10] = '\0';
      plaintext[0x11] = '\0';
      plaintext[0x12] = '\0';
      plaintext[0x13] = '\0';
      plaintext[0x14] = '\0';
      plaintext[0x15] = '\0';
      plaintext[0x16] = '\0';
      plaintext[0x17] = '\0';
      plaintext[0] = '\0';
      plaintext[1] = '\0';
      plaintext[2] = '\0';
      plaintext[3] = '\0';
      plaintext[4] = '\0';
      plaintext[5] = '\0';
      plaintext[6] = '\0';
      plaintext[7] = '\0';
      plaintext[8] = '\0';
      plaintext[9] = '\0';
      plaintext[10] = '\0';
      plaintext[0xb] = '\0';
      plaintext[0xc] = '\0';
      plaintext[0xd] = '\0';
      plaintext[0xe] = '\0';
      plaintext[0xf] = '\0';
      ciphertext[0] = '\0';
      ciphertext[1] = '\0';
      ciphertext[2] = '\0';
      ciphertext[3] = '\0';
      ciphertext[4] = '\0';
      ciphertext[5] = '\0';
      ciphertext[6] = '\0';
      ciphertext[7] = '\0';
      ciphertext[8] = '\0';
      ciphertext[9] = '\0';
      ciphertext[10] = '\0';
      ciphertext[0xb] = '\0';
      ciphertext[0xc] = '\0';
      ciphertext[0xd] = '\0';
      ciphertext[0xe] = '\0';
      ciphertext[0xf] = '\0';
      ciphertext[0x10] = '\0';
      ciphertext[0x11] = '\0';
      ciphertext[0x12] = '\0';
      ciphertext[0x13] = '\0';
      ciphertext[0x14] = '\0';
      ciphertext[0x15] = '\0';
      ciphertext[0x16] = '\0';
      ciphertext[0x17] = '\0';
      ciphertext[0x18] = '\0';
      ciphertext[0x19] = '\0';
      ciphertext[0x1a] = '\0';
      ciphertext[0x1b] = '\0';
      ciphertext[0x1c] = '\0';
      ciphertext[0x1d] = '\0';
      ciphertext[0x1e] = '\0';
      ciphertext[0x1f] = '\0';
      __n = *(size_t *)((long)msg_len_test_data + lVar4);
      memcpy(plaintext," !\"#$%&\'()*+,-./01234567",__n);
      iv_len = *(size_t *)((long)iv_len_test_data + lVar4);
      add_len = *(size_t *)((long)add_len_test_data + lVar4);
      tag_len = *(size_t *)((long)tag_len_test_data + lVar4);
      iVar2 = mbedtls_ccm_encrypt_and_tag
                        (&ctx,__n,"\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b",iv_len,"",
                         add_len,plaintext,ciphertext,ciphertext + __n,tag_len);
      if ((iVar2 != 0) || (iVar2 = bcmp(ciphertext,local_e0,tag_len + __n), iVar2 != 0)) {
LAB_00110437:
        if (verbose == 0) {
          return 1;
        }
        puts("failed");
        return 1;
      }
      plaintext[0] = '\0';
      plaintext[1] = '\0';
      plaintext[2] = '\0';
      plaintext[3] = '\0';
      plaintext[4] = '\0';
      plaintext[5] = '\0';
      plaintext[6] = '\0';
      plaintext[7] = '\0';
      plaintext[8] = '\0';
      plaintext[9] = '\0';
      plaintext[10] = '\0';
      plaintext[0xb] = '\0';
      plaintext[0xc] = '\0';
      plaintext[0xd] = '\0';
      plaintext[0xe] = '\0';
      plaintext[0xf] = '\0';
      plaintext[0x10] = '\0';
      plaintext[0x11] = '\0';
      plaintext[0x12] = '\0';
      plaintext[0x13] = '\0';
      plaintext[0x14] = '\0';
      plaintext[0x15] = '\0';
      plaintext[0x16] = '\0';
      plaintext[0x17] = '\0';
      iVar2 = mbedtls_ccm_auth_decrypt
                        (&ctx,__n,"\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b",iv_len,"",
                         add_len,ciphertext,plaintext,ciphertext + __n,tag_len);
      if ((iVar2 != 0) || (iVar2 = bcmp(plaintext," !\"#$%&\'()*+,-./01234567",__n), iVar2 != 0))
      goto LAB_00110437;
      if (verbose != 0) {
        puts("passed");
      }
      uVar3 = uVar3 + 1;
      local_e0 = local_e0 + 1;
    }
    mbedtls_ccm_free(&ctx);
    iVar2 = 0;
    if (verbose != 0) {
      putchar(10);
    }
  }
  else if (verbose != 0) {
    printf("  CCM: setup failed");
  }
  return iVar2;
}

Assistant:

int mbedtls_ccm_self_test( int verbose )
{
    mbedtls_ccm_context ctx;
    /*
     * Some hardware accelerators require the input and output buffers
     * would be in RAM, because the flash is not accessible.
     * Use buffers on the stack to hold the test vectors data.
     */
    unsigned char plaintext[CCM_SELFTEST_PT_MAX_LEN];
    unsigned char ciphertext[CCM_SELFTEST_CT_MAX_LEN];
    size_t i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    mbedtls_ccm_init( &ctx );

    if( mbedtls_ccm_setkey( &ctx, MBEDTLS_CIPHER_ID_AES, key_test_data,
                            8 * sizeof key_test_data ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "  CCM: setup failed" );

        return( 1 );
    }

    for( i = 0; i < NB_TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  CCM-AES #%u: ", (unsigned int) i + 1 );

        memset( plaintext, 0, CCM_SELFTEST_PT_MAX_LEN );
        memset( ciphertext, 0, CCM_SELFTEST_CT_MAX_LEN );
        memcpy( plaintext, msg_test_data, msg_len_test_data[i] );

        ret = mbedtls_ccm_encrypt_and_tag( &ctx, msg_len_test_data[i],
                                           iv_test_data, iv_len_test_data[i],
                                           ad_test_data, add_len_test_data[i],
                                           plaintext, ciphertext,
                                           ciphertext + msg_len_test_data[i],
                                           tag_len_test_data[i] );

        if( ret != 0 ||
            memcmp( ciphertext, res_test_data[i],
                    msg_len_test_data[i] + tag_len_test_data[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
        memset( plaintext, 0, CCM_SELFTEST_PT_MAX_LEN );

        ret = mbedtls_ccm_auth_decrypt( &ctx, msg_len_test_data[i],
                                        iv_test_data, iv_len_test_data[i],
                                        ad_test_data, add_len_test_data[i],
                                        ciphertext, plaintext,
                                        ciphertext + msg_len_test_data[i],
                                        tag_len_test_data[i] );

        if( ret != 0 ||
            memcmp( plaintext, msg_test_data, msg_len_test_data[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    mbedtls_ccm_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}